

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.h
# Opt level: O3

BasicStringView<char> __thiscall
Corrade::Containers::BasicStringView<char>::findLastOr
          (BasicStringView<char> *this,StringView substring,char *fail)

{
  char *begin;
  ulong substringSize;
  BasicStringView<char> local_28;
  
  substringSize = substring._sizePlusFlags & 0x3fffffffffffffff;
  begin = Implementation::stringFindLastString
                    (this->_data,this->_sizePlusFlags & 0x3fffffffffffffff,substring._data,
                     substringSize);
  if (begin == (char *)0x0) {
    BasicStringView(&local_28,fail,0,(nullptr_t)0x0);
  }
  else {
    local_28 = slice(this,begin,begin + substringSize);
  }
  return local_28;
}

Assistant:

inline BasicStringView<T> BasicStringView<T>::findLastOr(const StringView substring, T* const fail) const {
    /* Cache the getters to speed up debug builds */
    const std::size_t substringSize = substring.size();
    if(const char* const found = Implementation::stringFindLastString(_data, size(), substring._data, substringSize))
        return slice(const_cast<T*>(found), const_cast<T*>(found + substringSize));

    /* Using an internal assert-less constructor, the public constructor
       asserts would be redundant. Since it's a zero-sized view, it doesn't
       really make sense to try to preserve any flags. */
    return BasicStringView<T>{fail, 0 /* empty, no flags */, nullptr};
}